

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O1

bool __thiscall osQueue::Contains(osQueue *this,void *object)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  
  osMutex::Take(&this->Lock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0x95);
  iVar1 = this->ElementCount;
  bVar5 = 0 < iVar1;
  if (0 < iVar1) {
    uVar4 = (ulong)this->NextOutIndex;
    if (this->Array[uVar4] != object) {
      iVar2 = 1;
      do {
        iVar6 = iVar2;
        if (iVar1 == iVar6) break;
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        if (this->MaxElements <= (int)uVar3) {
          uVar4 = 0;
        }
        iVar2 = iVar6 + 1;
      } while (this->Array[(int)uVar4] != object);
      bVar5 = iVar6 < iVar1;
    }
  }
  osMutex::Give(&this->Lock);
  return bVar5;
}

Assistant:

bool osQueue::Contains(void* object)
{
    bool rc = false;
    int index;
    int i;

    Lock.Take(__FILE__, __LINE__);

    index = NextOutIndex;

    for (i = 0; i < ElementCount; i++)
    {
        if (object == Array[index])
        {
            rc = true;
            break;
        }
        index = Increment(index);
    }

    Lock.Give();

    return rc;
}